

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

uint16_t container_minimum(container_t *c,uint8_t type)

{
  uint8_t local_19;
  array_container_t *paStack_18;
  uint8_t type_local;
  container_t *c_local;
  
  local_19 = type;
  paStack_18 = (array_container_t *)c;
  paStack_18 = (array_container_t *)container_unwrap_shared(c,&local_19);
  if (local_19 == '\x01') {
    c_local._6_2_ = bitset_container_minimum((bitset_container_t *)paStack_18);
  }
  else if (local_19 == '\x02') {
    c_local._6_2_ = array_container_minimum(paStack_18);
  }
  else {
    if (local_19 != '\x03') {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x18d8,"uint16_t container_minimum(const container_t *, uint8_t)");
    }
    c_local._6_2_ = run_container_minimum((run_container_t *)paStack_18);
  }
  return c_local._6_2_;
}

Assistant:

static inline uint16_t container_minimum(
    const container_t *c, uint8_t type
){
    c = container_unwrap_shared(c, &type);
    switch (type) {
        case BITSET_CONTAINER_TYPE:
            return bitset_container_minimum(const_CAST_bitset(c));
        case ARRAY_CONTAINER_TYPE:
            return array_container_minimum(const_CAST_array(c));
        case RUN_CONTAINER_TYPE:
            return run_container_minimum(const_CAST_run(c));
        default:
            assert(false);
            __builtin_unreachable();
    }
    assert(false);
    __builtin_unreachable();
    return false;
}